

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O2

string * __thiscall
soul::Program::ProgramImpl::getTypeDescriptionWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,pool_ptr<const_soul::Module> *context,
          Type *type)

{
  _Any_data local_78;
  code *local_68;
  code *local_60;
  anon_class_16_2_06e2585c local_50;
  string local_40;
  
  local_50.context = (pool_ptr<const_soul::Module>)context->object;
  if (local_50.context.object == (Module *)0x0) {
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_Program.cpp:236:34)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_Program.cpp:236:34)>
               ::_M_manager;
    Type::getDescription
              (&local_40,type,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
                *)&local_78);
    std::__cxx11::string::~string((string *)&local_40);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    local_50.context = (pool_ptr<const_soul::Module>)context->object;
  }
  local_50.this = this;
  std::function<std::__cxx11::string(soul::Structure_const&)>::
  function<soul::Program::ProgramImpl::getTypeDescriptionWithQualificationIfNeeded(soul::pool_ptr<soul::Module_const>,soul::Type_const&)const::_lambda(soul::Structure_const&)_2_,void>
            ((function<std::__cxx11::string(soul::Structure_const&)> *)local_78._M_pod_data,
             &local_50);
  Type::getDescription
            (__return_storage_ptr__,type,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
              *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string getTypeDescriptionWithQualificationIfNeeded (pool_ptr<const Module> context, const Type& type) const
    {
        if (context == nullptr)
            type.getDescription ([] (const Structure& s) { return s.getName(); });

        return type.getDescription ([this, context] (const Structure& s) { return getStructNameWithQualificationIfNeeded (context, s); });
    }